

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::PropertyExprSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((((kind == AcceptOnPropertyExpr) || (kind == AndPropertyExpr)) || (kind == CasePropertyExpr))
      || (((kind == ClockingPropertyExpr || (kind == ConditionalPropertyExpr)) ||
          ((kind == FollowedByPropertyExpr ||
           ((kind == IffPropertyExpr || (kind == ImplicationPropertyExpr)))))))) ||
     ((kind == ImpliesPropertyExpr ||
      (((((kind == OrPropertyExpr || (kind == ParenthesizedPropertyExpr)) ||
         (kind - SUntilPropertyExpr < 2)) ||
        ((kind == SimplePropertyExpr || (kind == StrongWeakPropertyExpr)))) ||
       ((kind - UnaryPropertyExpr < 2 ||
        (kind == UntilPropertyExpr || kind == UntilWithPropertyExpr)))))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PropertyExprSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AcceptOnPropertyExpr:
        case SyntaxKind::AndPropertyExpr:
        case SyntaxKind::CasePropertyExpr:
        case SyntaxKind::ClockingPropertyExpr:
        case SyntaxKind::ConditionalPropertyExpr:
        case SyntaxKind::FollowedByPropertyExpr:
        case SyntaxKind::IffPropertyExpr:
        case SyntaxKind::ImplicationPropertyExpr:
        case SyntaxKind::ImpliesPropertyExpr:
        case SyntaxKind::OrPropertyExpr:
        case SyntaxKind::ParenthesizedPropertyExpr:
        case SyntaxKind::SUntilPropertyExpr:
        case SyntaxKind::SUntilWithPropertyExpr:
        case SyntaxKind::SimplePropertyExpr:
        case SyntaxKind::StrongWeakPropertyExpr:
        case SyntaxKind::UnaryPropertyExpr:
        case SyntaxKind::UnarySelectPropertyExpr:
        case SyntaxKind::UntilPropertyExpr:
        case SyntaxKind::UntilWithPropertyExpr:
            return true;
        default:
            return false;
    }
}